

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

FUNCTION_RETURN
license::os::getAdapterInfos
          (vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
           *adapterInfos)

{
  sa_family_t sVar1;
  undefined4 uVar2;
  char *szptr;
  sockaddr *psVar3;
  __node_base_ptr this;
  bool bVar4;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  mapped_type *__dest;
  pointer ppVar8;
  size_type sVar9;
  reference ppVar10;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double dVar11;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>
  *it_1;
  iterator __end3;
  iterator __begin3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
  *__range3;
  int i;
  sockaddr_ll *s1_1;
  in_addr_t iaddr;
  sockaddr_in *s1;
  iterator it;
  char local_4d8 [4];
  OsAdapterInfo newAdapter;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
  local_c0;
  anon_struct_1044_5_0902c47b_for_second *local_b8;
  OsAdapterInfo *currentAdapter;
  undefined1 local_a8 [8];
  string if_name;
  uint if_num;
  int n;
  int family;
  ifaddrs *ifa;
  ifaddrs *ifaddr;
  undefined1 local_50 [4];
  FUNCTION_RETURN f_return;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
  adapterByName;
  vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
  *adapterInfos_local;
  
  adapterByName._M_h._M_single_bucket = (__node_base_ptr)adapterInfos;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                   *)local_50);
  ifaddr._4_4_ = FUNC_RET_OK;
  iVar5 = getifaddrs(&ifa);
  if (iVar5 == -1) {
    piVar6 = __errno_location();
    dVar11 = extraout_XMM0_Qa;
    if (*piVar6 != 0) {
      piVar6 = __errno_location();
      strerror(*piVar6);
      dVar11 = extraout_XMM0_Qa_00;
    }
    _log(dVar11);
    adapterInfos_local._4_4_ = FUNC_RET_ERROR;
  }
  else {
    for (_n = ifa; _n != (ifaddrs *)0x0; _n = _n->ifa_next) {
      if ((_n->ifa_addr != (sockaddr *)0x0) && ((_n->ifa_flags & 8) == 0)) {
        szptr = _n->ifa_name;
        sVar7 = mstrnlen_s(szptr,0x401);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_a8,szptr,sVar7,(allocator *)((long)&currentAdapter + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&currentAdapter + 7));
        local_c0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                     *)local_50,(key_type *)local_a8);
        newAdapter._1036_8_ =
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                    *)local_50);
        bVar4 = std::__detail::operator==
                          (&local_c0,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                            *)newAdapter.ipv4_address);
        if (bVar4) {
          memset((void *)((long)&it.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                                 ._M_cur + 4),0,0x414);
          mstrlcpy(local_4d8,_n->ifa_name,0x401);
          __dest = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                                 *)local_50,(key_type *)local_a8);
          memcpy(__dest,(void *)((long)&it.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                                        ._M_cur + 4),0x414);
        }
        s1 = (sockaddr_in *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                     *)local_50,(key_type *)local_a8);
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_false,_true>
                               *)&s1);
        local_b8 = &ppVar8->second;
        sVar1 = _n->ifa_addr->sa_family;
        dVar11 = _log(__x);
        if (sVar1 == 2) {
          uVar2 = *(undefined4 *)(_n->ifa_addr->sa_data + 2);
          local_b8->ipv4_address[0] = (uchar)uVar2;
          local_b8->ipv4_address[1] = (uchar)((uint)uVar2 >> 8);
          local_b8->ipv4_address[2] = (uchar)((uint)uVar2 >> 0x10);
          local_b8->ipv4_address[3] = (uchar)((uint)uVar2 >> 0x18);
        }
        else if ((sVar1 == 0x11) && (_n->ifa_data != (void *)0x0)) {
          psVar3 = _n->ifa_addr;
          for (__range3._4_4_ = 0; __range3._4_4_ < 6; __range3._4_4_ = __range3._4_4_ + 1) {
            local_b8->mac_address[__range3._4_4_] = psVar3->sa_data[(long)__range3._4_4_ + 10];
            dVar11 = _log(dVar11);
          }
          _log(dVar11);
        }
        std::__cxx11::string::~string((string *)local_a8);
      }
    }
    freeifaddrs(ifa);
    sVar9 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
            ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                    *)local_50);
    this = adapterByName._M_h._M_single_bucket;
    if (sVar9 == 0) {
      ifaddr._4_4_ = FUNC_RET_NOT_AVAIL;
    }
    else {
      ifaddr._4_4_ = FUNC_RET_OK;
      sVar9 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
              ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                      *)local_50);
      std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::reserve
                ((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *)
                 this,sVar9);
      __end3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
               ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                        *)local_50);
      it_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>
              *)std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                       *)local_50);
      while (bVar4 = std::__detail::operator!=
                               (&__end3.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                                ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                                  *)&it_1), bVar4) {
        ppVar10 = std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_false,_true>
                  ::operator*(&__end3);
        std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::
        push_back((vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_> *
                  )adapterByName._M_h._M_single_bucket,(value_type *)&ppVar10->second);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_false,_true>
        ::operator++(&__end3);
      }
    }
    adapterInfos_local._4_4_ = ifaddr._4_4_;
  }
  if_name.field_2._8_4_ = 1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
                    *)local_50);
  return adapterInfos_local._4_4_;
}

Assistant:

FUNCTION_RETURN getAdapterInfos(vector<OsAdapterInfo> &adapterInfos) {
	unordered_map<string, OsAdapterInfo> adapterByName;

	FUNCTION_RETURN f_return = FUNC_RET_OK;
	struct ifaddrs *ifaddr, *ifa;
	int family, n = 0;
	unsigned int if_num;

	if (getifaddrs(&ifaddr) == -1) {
		LOG_WARN("getifaddrs failed == -1");
		return FUNC_RET_ERROR;
	}

	for (ifa = ifaddr, n = 0, if_num = 0; ifa != NULL; ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL || (ifa->ifa_flags & IFF_LOOPBACK) != 0) {
			continue;
		}
		string if_name(ifa->ifa_name, mstrnlen_s(ifa->ifa_name, LCC_ADAPTER_DESCRIPTION_LEN));
		// if_name_position = ifname_position(ifnames, ifa->ifa_name, if_num);
		// interface name not seen en advance
		OsAdapterInfo *currentAdapter;
		if (adapterByName.find(if_name) == adapterByName.end()) {
			OsAdapterInfo newAdapter;
			memset(&newAdapter, 0, sizeof(OsAdapterInfo));
			mstrlcpy(&newAdapter.description[0], ifa->ifa_name, LCC_ADAPTER_DESCRIPTION_LEN);
			adapterByName[if_name] = newAdapter;
		}
		auto it = adapterByName.find(if_name);
		currentAdapter = &it->second;
		family = ifa->ifa_addr->sa_family;
		/* Display interface name and family (including symbolic
		 form of the latter for the common families) */
		LOG_DEBUG("%-8s %s (%d)\n", ifa->ifa_name,
				  (family == AF_PACKET) ? "AF_PACKET"
										: (family == AF_INET) ? "AF_INET" : (family == AF_INET6) ? "AF_INET6" : "???",
				  family);
		/* For an AF_INET* interface address, display the address
		 * || family == AF_INET6*/
		if (family == AF_INET) {
			struct sockaddr_in *s1 = (struct sockaddr_in *)ifa->ifa_addr;
			in_addr_t iaddr = s1->sin_addr.s_addr;
			currentAdapter->ipv4_address[0] = (iaddr & 0x000000ff);
			currentAdapter->ipv4_address[1] = (iaddr & 0x0000ff00) >> 8;
			currentAdapter->ipv4_address[2] = (iaddr & 0x00ff0000) >> 16;
			currentAdapter->ipv4_address[3] = (iaddr & 0xff000000) >> 24;

		} else if (family == AF_PACKET && ifa->ifa_data != NULL) {
			struct sockaddr_ll *s1 = (struct sockaddr_ll *)ifa->ifa_addr;
			int i;
			for (i = 0; i < 6; i++) {
				currentAdapter->mac_address[i] = s1->sll_addr[i];
				LOG_DEBUG("%02x:", s1->sll_addr[i]);
			}
			LOG_DEBUG("\t %s\n", ifa->ifa_name);
		}
	}
	freeifaddrs(ifaddr);

	// FIXME sort by eth , enps, wlan
	if (adapterByName.size() == 0) {
		f_return = FUNC_RET_NOT_AVAIL;
	} else {
		f_return = FUNC_RET_OK;
		adapterInfos.reserve(adapterByName.size());
		for (auto &it : adapterByName) {
			adapterInfos.push_back(it.second);
		}
	}
	return f_return;
}